

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O0

CodePrinter * __thiscall choc::text::CodePrinter::operator<<(CodePrinter *this,uint v)

{
  string local_38;
  uint local_14;
  CodePrinter *pCStack_10;
  uint v_local;
  CodePrinter *this_local;
  
  local_14 = v;
  pCStack_10 = this;
  std::__cxx11::to_string(&local_38,v);
  append(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

CodePrinter& CodePrinter::operator<< (IntegerType v)
{
    static_assert (std::is_integral<IntegerType>::value, "You're probably trying to write a type that's not supported");
    append (std::to_string (v));
    return *this;
}